

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxIn::ConfidentialTxIn
          (ConfidentialTxIn *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script,ScriptWitness *witness_stack,ByteData256 *blinding_nonce,
          ByteData256 *asset_entropy,ConfidentialValue *issuance_amount,
          ConfidentialValue *inflation_keys,ByteData *issuance_amount_rangeproof,
          ByteData *inflation_keys_rangeproof,ScriptWitness *pegin_witness)

{
  ScriptWitness *witness_stack_local;
  Script *unlocking_script_local;
  uint32_t sequence_local;
  uint32_t index_local;
  Txid *txid_local;
  ConfidentialTxIn *this_local;
  
  AbstractTxIn::AbstractTxIn(&this->super_AbstractTxIn,txid,index,sequence,unlocking_script);
  (this->super_AbstractTxIn)._vptr_AbstractTxIn = (_func_int **)&PTR__ConfidentialTxIn_003ebf88;
  ByteData256::ByteData256(&this->blinding_nonce_,blinding_nonce);
  ByteData256::ByteData256(&this->asset_entropy_,asset_entropy);
  ConfidentialValue::ConfidentialValue(&this->issuance_amount_,issuance_amount);
  ConfidentialValue::ConfidentialValue(&this->inflation_keys_,inflation_keys);
  ByteData::ByteData(&this->issuance_amount_rangeproof_,issuance_amount_rangeproof);
  ByteData::ByteData(&this->inflation_keys_rangeproof_,inflation_keys_rangeproof);
  ScriptWitness::ScriptWitness(&this->pegin_witness_,pegin_witness);
  ScriptWitness::operator=(&(this->super_AbstractTxIn).script_witness_,witness_stack);
  return;
}

Assistant:

ConfidentialTxIn::ConfidentialTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script, const ScriptWitness &witness_stack,
    const ByteData256 &blinding_nonce, const ByteData256 &asset_entropy,
    const ConfidentialValue &issuance_amount,
    const ConfidentialValue &inflation_keys,
    const ByteData &issuance_amount_rangeproof,
    const ByteData &inflation_keys_rangeproof,
    const ScriptWitness &pegin_witness)
    : AbstractTxIn(txid, index, sequence, unlocking_script),
      blinding_nonce_(blinding_nonce),
      asset_entropy_(asset_entropy),
      issuance_amount_(issuance_amount),
      inflation_keys_(inflation_keys),
      issuance_amount_rangeproof_(issuance_amount_rangeproof),
      inflation_keys_rangeproof_(inflation_keys_rangeproof),
      pegin_witness_(pegin_witness) {
  script_witness_ = witness_stack;
}